

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

size_t bc_slist_length(bc_slist_t *l)

{
  bc_slist_t *local_28;
  bc_slist_t *tmp;
  size_t i;
  bc_slist_t *l_local;
  
  if (l == (bc_slist_t *)0x0) {
    l_local = (bc_slist_t *)0x0;
  }
  else {
    tmp = (bc_slist_t *)0x0;
    for (local_28 = l; local_28 != (bc_slist_t *)0x0; local_28 = local_28->next) {
      tmp = (bc_slist_t *)((long)&tmp->next + 1);
    }
    l_local = tmp;
  }
  return (size_t)l_local;
}

Assistant:

size_t
bc_slist_length(bc_slist_t *l)
{
    if (l == NULL)
        return 0;
    size_t i;
    bc_slist_t *tmp;
    for (tmp = l, i = 0; tmp != NULL; tmp = tmp->next, i++);
    return i;
}